

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall
wallet::CWallet::SetMinVersion(CWallet *this,WalletFeature nVersion,WalletBatch *batch_in)

{
  long lVar1;
  WalletBatch *this_00;
  WalletDatabase *pWVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock18,&this->cs_wallet,"cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x292,false);
  if (this->nWalletVersion < (int)nVersion) {
    WalletLogPrintf<wallet::WalletFeature>(this,"Setting minversion to %d\n",nVersion);
    this->nWalletVersion = nVersion;
    this_00 = batch_in;
    if (batch_in == (WalletBatch *)0x0) {
      this_00 = (WalletBatch *)operator_new(0x10);
      pWVar2 = GetDatabase(this);
      (*pWVar2->_vptr_WalletDatabase[0xe])(this_00,pWVar2,1);
      this_00->m_database = pWVar2;
      nVersion = this->nWalletVersion;
    }
    if (40000 < (int)nVersion) {
      WalletBatch::WriteMinVersion(this_00,nVersion);
    }
    if (batch_in == (WalletBatch *)0x0) {
      std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::
      ~unique_ptr(&this_00->m_batch);
      operator_delete(this_00,0x10);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock18.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::SetMinVersion(enum WalletFeature nVersion, WalletBatch* batch_in)
{
    LOCK(cs_wallet);
    if (nWalletVersion >= nVersion)
        return;
    WalletLogPrintf("Setting minversion to %d\n", nVersion);
    nWalletVersion = nVersion;

    {
        WalletBatch* batch = batch_in ? batch_in : new WalletBatch(GetDatabase());
        if (nWalletVersion > 40000)
            batch->WriteMinVersion(nWalletVersion);
        if (!batch_in)
            delete batch;
    }
}